

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota.cc
# Opt level: O1

void * thread_routine(void *vparam)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  lVar7 = 0;
  uVar3 = 0;
  pvVar2 = (void *)0x0;
  do {
    pvVar2 = (void *)((long)pvVar2 +
                     (ulong)((quota.value >> 0x16 & 0x3fffffffc00) <
                            (quota.value & 0xffffffff) << 10));
    iVar1 = rand();
    uVar8 = (ulong)(long)iVar1 % 0x3fffffffc00 + 0x3ff;
    uVar4 = uVar8 >> 10;
    do {
      iVar1 = 1;
      if ((uint)quota.value <= (uint)uVar4) {
        quota.value = quota.value & 0xffffffff | uVar4 << 0x20;
        LOCK();
        UNLOCK();
        iVar1 = 3;
      }
    } while (iVar1 == 0);
    if (iVar1 == 3) {
      uVar8 = uVar8 & 0x3fffffffc00;
    }
    else {
      uVar8 = 0xffffffffffffffff;
    }
    sched_yield();
    if (0 < (long)uVar8) {
      *(ulong *)((long)vparam + 8) = uVar8;
      *(long *)((long)vparam + 0x18) = *(long *)((long)vparam + 0x18) + 1;
    }
    if ((long)uVar3 < 1) {
      iVar1 = rand();
      lVar5 = (long)iVar1 % (long)uVar8;
      uVar3 = 0xffffffffffffffff;
      if (lVar5 + 1U < 0x3fffffffc01) {
        if (lVar5 == -1) {
          __assert_fail("size_in_units",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                        ,0x89,"ssize_t quota_use(struct quota *, size_t)");
        }
        do {
          uVar6 = (uint)quota.value + (int)(lVar5 + 0x400U >> 10);
          if (uVar6 <= (uint)quota.value) {
            __assert_fail("new_used_in_units > used_in_units",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                          ,0x90,"ssize_t quota_use(struct quota *, size_t)");
          }
          iVar1 = 1;
          if (uVar6 <= (uint)(quota.value >> 0x20)) {
            quota.value = (ulong)uVar6 | quota.value & 0xffffffff00000000;
            LOCK();
            UNLOCK();
            iVar1 = 3;
          }
        } while (iVar1 == 0);
        if (iVar1 == 3) {
          uVar3 = lVar5 + 0x400U & 0x3fffffffc00;
        }
      }
      uVar4 = uVar3;
      if (0 < (long)uVar3) goto LAB_001014f6;
    }
    else {
      uVar6 = (uint)(uVar3 + 0x3ff >> 10);
      if ((uint)quota.value < uVar6) {
        __assert_fail("size_in_units <= used_in_units",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                      ,0xab,"ssize_t quota_release(struct quota *, size_t)");
      }
      quota.value = (ulong)((uint)quota.value - uVar6) | quota.value & 0xffffffff00000000;
      LOCK();
      UNLOCK();
      uVar3 = 0xffffffffffffffff;
      uVar4 = 0;
LAB_001014f6:
      *(ulong *)vparam = uVar4;
      *(long *)((long)vparam + 0x10) = *(long *)((long)vparam + 0x10) + 1;
    }
    sched_yield();
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x20000) {
      return pvVar2;
    }
  } while( true );
}

Assistant:

void *thread_routine(void *vparam)
{
	struct thread_data *data = (struct thread_data *)vparam;
	size_t check_fail_count = 0;
	ssize_t allocated_size = 0;
	for (size_t i = 0; i < RUN_CNT; i++) {
		{
			size_t total, used;
			quota_get_total_and_used(&quota, &total, &used);
			if (used > total)
				check_fail_count++;
		}
		ssize_t max = rand() % QUOTA_MAX;
		max = quota_set(&quota, max);
		sched_yield();
		if (max > 0) {
			data->last_lim_set = max;
			data->lim_change_success++;
		}
		if (allocated_size > 0) {
			quota_release(&quota, allocated_size);
			allocated_size = -1;
			data->use_change = 0;
			data->use_change_success++;
			sched_yield();
		} else {
			allocated_size = rand() % max + 1;
			allocated_size = quota_use(&quota, allocated_size);
			if (allocated_size > 0) {
				data->use_change = allocated_size;
				data->use_change_success++;
			}
			sched_yield();
		}
	}
	return (void *)check_fail_count;
}